

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

bool __thiscall DMessageBoxMenu::MenuEvent(DMessageBoxMenu *this,int mkey,bool fromcontroller)

{
  _func_int **pp_Var1;
  ulong uVar2;
  FSoundID local_c;
  
  if (this->mMessageMode == 0) {
    if ((uint)mkey < 2) {
      local_c.ID = S_FindSound("menu/cursor");
      S_Sound(0x22,&local_c,snd_menuvolume.Value,0.0);
      this->messageSelection = (uint)(this->messageSelection == 0);
    }
    else {
      if (mkey == 7) {
        pp_Var1 = (this->super_DMenu).super_DObject._vptr_DObject;
        uVar2 = 0;
      }
      else {
        if (mkey != 6) {
          return false;
        }
        uVar2 = (ulong)(this->messageSelection == 0);
        pp_Var1 = (this->super_DMenu).super_DObject._vptr_DObject;
      }
      (*pp_Var1[0xf])(this,uVar2);
    }
  }
  else {
    (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
    CloseSound(this);
  }
  return true;
}

Assistant:

bool DMessageBoxMenu::MenuEvent(int mkey, bool fromcontroller)
{
	if (mMessageMode == 0)
	{
		if (mkey == MKEY_Up || mkey == MKEY_Down)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
			messageSelection = !messageSelection;
			return true;
		}
		else if (mkey == MKEY_Enter)
		{
			// 0 is yes, 1 is no
			HandleResult(!messageSelection);
			return true;
		}
		else if (mkey == MKEY_Back)
		{
			HandleResult(false);
			return true;
		}
		return false;
	}
	else
	{
		Close();
		CloseSound();
		return true;
	}
}